

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int run_script(uint script_id,uint numPar,uint32_t *param)

{
  int iVar1;
  undefined8 in_RDX;
  gpioExtent_t *unaff_retaddr;
  int in_stack_00000008;
  gpioExtent_t ext [1];
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  iVar1 = pigpio_command_ext((int)in_RDX,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                             (int)((ulong)in_RDX >> 0x20),(int)in_RDX,0,unaff_retaddr,
                             in_stack_00000008);
  return iVar1;
}

Assistant:

int run_script(unsigned script_id, unsigned numPar, uint32_t *param)
{
   gpioExtent_t ext[1];

   /*
   p1=script id
   p2=0
   p3=numPar * 4
   ## extension ##
   uint32_t[numPar] pars
   */

   ext[0].size = 4 * numPar;
   ext[0].ptr = param;

   return pigpio_command_ext
      (gPigCommand, PI_CMD_PROCR, script_id, 0, numPar*4, 1, ext, 1);
}